

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O0

void __thiscall ast::Dir_space::Dir_space(Dir_space *this,Expression *s,Expression *i,Location left)

{
  Expression *pEVar1;
  Location l;
  uint16_t uVar2;
  uint uVar3;
  allocator local_69;
  string local_68;
  char *local_38;
  int iStack_30;
  int iStack_2c;
  int local_28;
  undefined4 uStack_24;
  Expression *local_20;
  Expression *i_local;
  Expression *s_local;
  Dir_space *this_local;
  
  l = left;
  local_28 = left.last_column;
  uStack_24 = left._20_4_;
  local_38 = left.unit;
  iStack_30 = left.line;
  iStack_2c = left.first_column;
  local_20 = i;
  i_local = s;
  s_local = (Expression *)this;
  Directive::Directive(&this->super_Directive,l);
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_space_0017e8d0;
  this->size = i_local;
  this->initial = local_20;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset =
       *(uint *)(Sections::current_section + 0x30);
  uVar3 = (*this->size->_vptr_Expression[3])();
  if ((uVar3 & 1) == 0) {
    pEVar1 = this->size;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,"Size parameter for .space directive must be defined before",
               &local_69);
    error_report(&pEVar1->location,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  else {
    uVar2 = Expression::get_value(this->size);
    (this->super_Directive).super_Statement.size_in_memory = (uint)uVar2;
  }
  Sections::increase((this->super_Directive).super_Statement.section_index,
                     (uint)(ushort)(this->super_Directive).super_Statement.size_in_memory);
  return;
}

Assistant:

Dir_space::Dir_space (Expression *s, Expression *i, Location left) :
	Directive {left}, size {s}, initial {i}
{
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	if (size->evaluate())
		size_in_memory = size->get_value();
	else
		error_report(&size->location, "Size parameter for .space directive must be defined before");
	Sections::increase(section_index, size_in_memory & 0xffff);
}